

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void printfFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  sqlite3 *psVar1;
  u32 n;
  char *pcVar2;
  long in_FS_OFFSET;
  undefined1 local_58 [24];
  undefined1 *puStack_40;
  undefined1 *local_38;
  sqlite3_value **ppsStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  ppsStack_30 = (sqlite3_value **)&DAT_aaaaaaaaaaaaaaaa;
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  if (0 < argc) {
    psVar1 = context->pOut->db;
    pcVar2 = (char *)sqlite3ValueText(*argv,'\x01');
    if (pcVar2 != (char *)0x0) {
      local_38 = (undefined1 *)(ulong)(argc - 1);
      ppsStack_30 = argv + 1;
      local_58._8_8_ = (char *)0x0;
      local_58._16_8_ = (ulong)(uint)psVar1->aLimit[0] << 0x20;
      puStack_40 = (undefined1 *)CONCAT26(puStack_40._6_2_,0x20000000000);
      local_58._0_8_ = psVar1;
      sqlite3_str_appendf((StrAccum *)local_58,pcVar2);
      n = (u32)puStack_40;
      pcVar2 = sqlite3StrAccumFinish((StrAccum *)local_58);
      setResultStrOrError(context,pcVar2,n,'\x01',sqlite3OomClear);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void printfFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  PrintfArguments x;
  StrAccum str;
  const char *zFormat;
  int n;
  sqlite3 *db = sqlite3_context_db_handle(context);

  if( argc>=1 && (zFormat = (const char*)sqlite3_value_text(argv[0]))!=0 ){
    x.nArg = argc-1;
    x.nUsed = 0;
    x.apArg = argv+1;
    sqlite3StrAccumInit(&str, db, 0, 0, db->aLimit[SQLITE_LIMIT_LENGTH]);
    str.printfFlags = SQLITE_PRINTF_SQLFUNC;
    sqlite3_str_appendf(&str, zFormat, &x);
    n = str.nChar;
    sqlite3_result_text(context, sqlite3StrAccumFinish(&str), n,
                        SQLITE_DYNAMIC);
  }
}